

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::removeRow(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  const_reference pQVar5;
  QModelIndex local_4b8;
  QModelIndex local_4a0;
  QModelIndex local_488;
  value_type local_470;
  qint32 local_454;
  qsizetype local_450;
  QModelIndex local_448;
  QModelIndex local_430;
  QModelIndex local_418;
  value_type local_400;
  qint32 local_3e4;
  qsizetype local_3e0;
  QModelIndex local_3d8;
  QModelIndex local_3c0;
  value_type local_3a8;
  qint32 local_38c;
  qsizetype local_388;
  QModelIndex local_380;
  QModelIndex local_368;
  undefined1 local_350 [8];
  QList<QVariant> arguments;
  qsizetype local_330;
  QModelIndex local_328;
  undefined1 local_310 [24];
  QModelIndex local_2f8;
  QModelIndex local_2e0;
  QModelIndex local_2c8;
  QModelIndex local_2b0;
  undefined1 local_298 [28];
  int local_27c;
  undefined1 local_278 [4];
  int oldRowCount;
  QSignalSpy sourceRowsRemovedSpy;
  QSignalSpy sourceRowsAboutToBeRemovedSpy;
  QSignalSpy proxyRowsRemovedSpy;
  undefined1 local_f0 [8];
  QSignalSpy proxyRowsAboutToBeRemovedSpy;
  undefined1 local_58 [40];
  RootIndexProxyModel local_30 [8];
  RootIndexProxyModel proxyModel;
  QAbstractItemModel *baseModel;
  tst_RootIndexProxyModel *this_local;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(local_30,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_30,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_30);
  QModelIndex::QModelIndex((QModelIndex *)&proxyRowsAboutToBeRemovedSpy.m_waiting);
  (**(code **)(*(long *)parent + 0x60))(local_58,parent,1,0,&proxyRowsAboutToBeRemovedSpy.m_waiting)
  ;
  RootIndexProxyModel::setRootIndex((QModelIndex *)local_30);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_f0,(QObject *)local_30,
             "2rowsAboutToBeRemoved(QModelIndex, int, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_f0);
  bVar2 = QTest::qVerify(bVar1,"proxyRowsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xff);
  if ((bVar2 & 1) == 0) {
    proxyRowsRemovedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)&sourceRowsAboutToBeRemovedSpy.m_waiting,(QObject *)local_30,
               "2rowsRemoved(QModelIndex, int, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceRowsAboutToBeRemovedSpy.m_waiting);
    bVar2 = QTest::qVerify(bVar1,"proxyRowsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x101);
    if ((bVar2 & 1) == 0) {
      proxyRowsRemovedSpy._124_4_ = 1;
    }
    else {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)&sourceRowsRemovedSpy.m_waiting,(QObject *)parent,
                 "2rowsAboutToBeRemoved(QModelIndex, int, int)");
      bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceRowsRemovedSpy.m_waiting);
      bVar2 = QTest::qVerify(bVar1,"sourceRowsAboutToBeRemovedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x103);
      if ((bVar2 & 1) == 0) {
        proxyRowsRemovedSpy._124_4_ = 1;
      }
      else {
        QSignalSpy::QSignalSpy
                  ((QSignalSpy *)local_278,(QObject *)parent,"2rowsRemoved(QModelIndex, int, int)");
        bVar1 = QSignalSpy::isValid((QSignalSpy *)local_278);
        bVar2 = QTest::qVerify(bVar1,"sourceRowsRemovedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x105);
        if ((bVar2 & 1) == 0) {
          proxyRowsRemovedSpy._124_4_ = 1;
        }
        else {
          QModelIndex::QModelIndex(&local_2b0);
          (**(code **)(*(long *)parent + 0x60))(local_298,parent,1,0,&local_2b0);
          iVar3 = (**(code **)(*(long *)parent + 0x78))(parent,local_298);
          local_27c = iVar3;
          QModelIndex::QModelIndex(&local_2c8);
          iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)local_30);
          bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0x107);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_2e0);
            RootIndexProxyModel::removeRows((int)local_30,1,(QModelIndex *)0x1);
            iVar3 = local_27c + -1;
            QModelIndex::QModelIndex(&local_2f8);
            iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)local_30);
            bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount - 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0x109);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              iVar3 = local_27c + -1;
              QModelIndex::QModelIndex(&local_328);
              (**(code **)(*(long *)parent + 0x60))(local_310,parent,1,0,&local_328);
              iVar4 = (**(code **)(*(long *)parent + 0x78))(parent,local_310);
              bVar2 = QTest::qCompare(iVar3,iVar4,"oldRowCount - 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0x10a);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                local_330 = QList<QList<QVariant>_>::count
                                      ((QList<QList<QVariant>_> *)
                                       &proxyRowsAboutToBeRemovedSpy.field_0x8);
                arguments.d.size._4_4_ = 1;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_330,(qint32 *)((long)&arguments.d.size + 4),
                                   "proxyRowsAboutToBeRemovedSpy.count()","1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x10b);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)local_350,
                             (QList<QList<QVariant>_> *)&proxyRowsAboutToBeRemovedSpy.field_0x8);
                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                  QVariant::value<QModelIndex>(&local_368,pQVar5);
                  QModelIndex::QModelIndex(&local_380);
                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_368,&local_380,"arguments.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x10d);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                    iVar3 = QVariant::value<int>(pQVar5);
                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0x10e);
                    if ((bVar2 & 1) == 0) {
                      proxyRowsRemovedSpy._124_4_ = 1;
                    }
                    else {
                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                      iVar3 = QVariant::value<int>(pQVar5);
                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0x10f);
                      if ((bVar2 & 1) == 0) {
                        proxyRowsRemovedSpy._124_4_ = 1;
                      }
                      else {
                        local_388 = QList<QList<QVariant>_>::count
                                              ((QList<QList<QVariant>_> *)
                                               &proxyRowsRemovedSpy.field_0x8);
                        local_38c = 1;
                        bVar1 = QTest::qCompare<long_long,int>
                                          (&local_388,&local_38c,"proxyRowsRemovedSpy.count()","1",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x110);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          QList<QList<QVariant>_>::takeFirst
                                    (&local_3a8,
                                     (QList<QList<QVariant>_> *)&proxyRowsRemovedSpy.field_0x8);
                          QList<QVariant>::operator=((QList<QVariant> *)local_350,&local_3a8);
                          QList<QVariant>::~QList(&local_3a8);
                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                          QVariant::value<QModelIndex>(&local_3c0,pQVar5);
                          QModelIndex::QModelIndex(&local_3d8);
                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_3c0,&local_3d8,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x112);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                            iVar3 = QVariant::value<int>(pQVar5);
                            bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x113);
                            if ((bVar2 & 1) == 0) {
                              proxyRowsRemovedSpy._124_4_ = 1;
                            }
                            else {
                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                              iVar3 = QVariant::value<int>(pQVar5);
                              bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x114);
                              if ((bVar2 & 1) == 0) {
                                proxyRowsRemovedSpy._124_4_ = 1;
                              }
                              else {
                                local_3e0 = QList<QList<QVariant>_>::count
                                                      ((QList<QList<QVariant>_> *)
                                                       &sourceRowsAboutToBeRemovedSpy.field_0x8);
                                local_3e4 = 1;
                                bVar1 = QTest::qCompare<long_long,int>
                                                  (&local_3e0,&local_3e4,
                                                   "sourceRowsAboutToBeRemovedSpy.count()","1",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x115);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  QList<QList<QVariant>_>::takeFirst
                                            (&local_400,
                                             (QList<QList<QVariant>_> *)
                                             &sourceRowsAboutToBeRemovedSpy.field_0x8);
                                  QList<QVariant>::operator=
                                            ((QList<QVariant> *)local_350,&local_400);
                                  QList<QVariant>::~QList(&local_400);
                                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                                  QVariant::value<QModelIndex>(&local_418,pQVar5);
                                  QModelIndex::QModelIndex(&local_448);
                                  (**(code **)(*(long *)parent + 0x60))
                                            (&local_430,parent,1,0,&local_448);
                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_418,&local_430,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x117);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                                    iVar3 = QVariant::value<int>(pQVar5);
                                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x118);
                                    if ((bVar2 & 1) == 0) {
                                      proxyRowsRemovedSpy._124_4_ = 1;
                                    }
                                    else {
                                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                                      iVar3 = QVariant::value<int>(pQVar5);
                                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x119);
                                      if ((bVar2 & 1) == 0) {
                                        proxyRowsRemovedSpy._124_4_ = 1;
                                      }
                                      else {
                                        local_450 = QList<QList<QVariant>_>::count
                                                              ((QList<QList<QVariant>_> *)
                                                               &sourceRowsRemovedSpy.field_0x8);
                                        local_454 = 1;
                                        bVar1 = QTest::qCompare<long_long,int>
                                                          (&local_450,&local_454,
                                                           "sourceRowsRemovedSpy.count()","1",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11a);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          QList<QList<QVariant>_>::takeFirst
                                                    (&local_470,
                                                     (QList<QList<QVariant>_> *)
                                                     &sourceRowsRemovedSpy.field_0x8);
                                          QList<QVariant>::operator=
                                                    ((QList<QVariant> *)local_350,&local_470);
                                          QList<QVariant>::~QList(&local_470);
                                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,
                                                                       0);
                                          QVariant::value<QModelIndex>(&local_488,pQVar5);
                                          QModelIndex::QModelIndex(&local_4b8);
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_4a0,parent,1,0,&local_4b8);
                                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_488,&local_4a0,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11c);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                         local_350,1);
                                            iVar3 = QVariant::value<int>(pQVar5);
                                            bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11d);
                                            if ((bVar2 & 1) == 0) {
                                              proxyRowsRemovedSpy._124_4_ = 1;
                                            }
                                            else {
                                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                           local_350,2);
                                              iVar3 = QVariant::value<int>(pQVar5);
                                              bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11e);
                                              if ((bVar2 & 1) == 0) {
                                                proxyRowsRemovedSpy._124_4_ = 1;
                                              }
                                              else {
                                                QObject::deleteLater();
                                                proxyRowsRemovedSpy._124_4_ = 0;
                                              }
                                            }
                                          }
                                          else {
                                            proxyRowsRemovedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          proxyRowsRemovedSpy._124_4_ = 1;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    proxyRowsRemovedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  proxyRowsRemovedSpy._124_4_ = 1;
                                }
                              }
                            }
                          }
                          else {
                            proxyRowsRemovedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          proxyRowsRemovedSpy._124_4_ = 1;
                        }
                      }
                    }
                  }
                  else {
                    proxyRowsRemovedSpy._124_4_ = 1;
                  }
                  QList<QVariant>::~QList((QList<QVariant> *)local_350);
                }
                else {
                  proxyRowsRemovedSpy._124_4_ = 1;
                }
              }
              else {
                proxyRowsRemovedSpy._124_4_ = 1;
              }
            }
            else {
              proxyRowsRemovedSpy._124_4_ = 1;
            }
          }
          else {
            proxyRowsRemovedSpy._124_4_ = 1;
          }
        }
        QSignalSpy::~QSignalSpy((QSignalSpy *)local_278);
      }
      QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceRowsRemovedSpy.m_waiting);
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceRowsAboutToBeRemovedSpy.m_waiting);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_f0);
  RootIndexProxyModel::~RootIndexProxyModel(local_30);
  return;
}

Assistant:

void tst_RootIndexProxyModel::removeRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeRemovedSpy(&proxyModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxyRowsRemovedSpy(&proxyModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsRemovedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeRemovedSpy(baseModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy sourceRowsRemovedSpy(baseModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsRemovedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.removeRows(1, 1);
    QCOMPARE(oldRowCount - 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount - 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeRemovedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsRemovedSpy.count(), 1);
    arguments = proxyRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeRemovedSpy.count(), 1);
    arguments = sourceRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsRemovedSpy.count(), 1);
    arguments = sourceRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}